

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_printf.h
# Opt level: O3

char * stbsp__clamp_callback(char *buf,void *user,int len)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  stbsp__context *c;
  char *pcVar4;
  
  uVar3 = *(uint *)((long)user + 8);
  if ((int)uVar3 < len) {
    len = uVar3;
  }
  if (len != 0) {
    pcVar4 = *user;
    if (pcVar4 != buf) {
      pcVar1 = buf + len;
      do {
        cVar2 = *buf;
        buf = buf + 1;
        *pcVar4 = cVar2;
        pcVar4 = pcVar4 + 1;
      } while (buf < pcVar1);
      pcVar4 = *user;
      uVar3 = *(uint *)((long)user + 8);
    }
    *(char **)user = pcVar4 + len;
    uVar3 = uVar3 - len;
    *(uint *)((long)user + 8) = uVar3;
  }
  if (0 < (int)uVar3) {
    if (0x1ff < uVar3) {
      return *user;
    }
    return (char *)((long)user + 0xc);
  }
  return (char *)0x0;
}

Assistant:

static char *stbsp__clamp_callback(char *buf, void *user, int len)
{
   stbsp__context *c = (stbsp__context *)user;

   if (len > c->count)
      len = c->count;

   if (len) {
      if (buf != c->buf) {
         char *s, *d, *se;
         d = c->buf;
         s = buf;
         se = buf + len;
         do {
            *d++ = *s++;
         } while (s < se);
      }
      c->buf += len;
      c->count -= len;
   }

   if (c->count <= 0)
      return 0;
   return (c->count >= STB_SPRINTF_MIN) ? c->buf : c->tmp; // go direct into buffer if you can
}